

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_set_format_zip(archive *_a)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  void *pvVar3;
  int magic_test;
  zip_conflict *zip;
  archive_write *a;
  archive *_a_local;
  
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_set_format_zip");
  if (iVar2 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    lVar1._0_4_ = _a[2].file_count;
    lVar1._4_4_ = _a[2].archive_error_number;
    if (lVar1 != 0) {
      (**(code **)&_a[2].file_count)(_a);
    }
    __ptr = calloc(1,0x130);
    if (__ptr == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate zip data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined4 *)((long)__ptr + 0xa0) = 0xffffffff;
      *(code **)((long)__ptr + 0x60) = real_crc32;
      *(undefined8 *)((long)__ptr + 0x120) = 0x10000;
      pvVar3 = malloc(*(size_t *)((long)__ptr + 0x120));
      *(void **)((long)__ptr + 0x128) = pvVar3;
      if (*(long *)((long)__ptr + 0x128) == 0) {
        free(__ptr);
        archive_set_error(_a,0xc,"Can\'t allocate compression buffer");
        _a_local._4_4_ = -0x1e;
      }
      else {
        *(void **)&_a[1].current_codepage = __ptr;
        _a[1].sconv = (archive_string_conv *)0x28aba9;
        _a[2].vtable = (archive_vtable_conflict *)archive_write_zip_options;
        _a[2].archive_format_name = (char *)archive_write_zip_header;
        *(code **)&_a[2].compression_code = archive_write_zip_data;
        *(code **)&_a[2].archive_format = archive_write_zip_finish_entry;
        _a[2].compression_name = (char *)archive_write_zip_close;
        *(code **)&_a[2].file_count = archive_write_zip_free;
        _a->archive_format = 0x50000;
        _a->archive_format_name = "ZIP";
        _a_local._4_4_ = 0;
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_write_set_format_zip(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct zip *zip;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_set_format_zip");

	/* If another format was already registered, unregister it. */
	if (a->format_free != NULL)
		(a->format_free)(a);

	zip = (struct zip *) calloc(1, sizeof(*zip));
	if (zip == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip data");
		return (ARCHIVE_FATAL);
	}

	/* "Unspecified" lets us choose the appropriate compression. */
	zip->requested_compression = COMPRESSION_UNSPECIFIED;
	zip->crc32func = real_crc32;

#ifdef HAVE_ZLIB_H
	zip->len_buf = 65536;
	zip->buf = malloc(zip->len_buf);
	if (zip->buf == NULL) {
		free(zip);
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate compression buffer");
		return (ARCHIVE_FATAL);
	}
#endif

	a->format_data = zip;
	a->format_name = "zip";
	a->format_options = archive_write_zip_options;
	a->format_write_header = archive_write_zip_header;
	a->format_write_data = archive_write_zip_data;
	a->format_finish_entry = archive_write_zip_finish_entry;
	a->format_close = archive_write_zip_close;
	a->format_free = archive_write_zip_free;
	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	a->archive.archive_format_name = "ZIP";

	return (ARCHIVE_OK);
}